

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_analysis.cc
# Opt level: O0

void __thiscall
pass_check_combinational_loop_Test::~pass_check_combinational_loop_Test
          (pass_check_combinational_loop_Test *this)

{
  pass_check_combinational_loop_Test *this_local;
  
  ~pass_check_combinational_loop_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(pass, check_combinational_loop) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &a = mod.var("a", 1);
    mod.add_stmt(a.assign(a + constant(1, 1)));
    fix_assignment_type(&mod);

    EXPECT_THROW(check_combinational_loop(&mod), StmtException);
}